

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  size_t sVar26;
  char cVar27;
  bool bVar28;
  ulong uVar29;
  long lVar30;
  size_t sVar31;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar32;
  NodeRef root;
  undefined4 uVar33;
  NodeRef *pNVar34;
  byte bVar35;
  uint uVar36;
  byte bVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  vint4 bi;
  undefined1 auVar61 [16];
  vint4 bi_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  vint4 bi_3;
  undefined1 auVar64 [16];
  vint4 ai;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai_1;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar74;
  float fVar75;
  vint4 bi_10;
  float fVar76;
  undefined1 auVar73 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  vfloat4 a0;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  uint local_3714;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar40;
  int iVar56;
  int iVar57;
  int iVar58;
  
  bvh = (BVH *)This->ptr;
  sVar31 = (bvh->root).ptr;
  if (sVar31 != 8) {
    auVar48 = *(undefined1 (*) [16])(ray + 0x80);
    auVar43 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar22 = ZEXT812(0) << 0x20;
    auVar44 = ZEXT816(0) << 0x40;
    uVar14 = vcmpps_avx512vl(auVar48,auVar44,5);
    uVar38 = vpcmpeqd_avx512vl(auVar43,(undefined1  [16])valid_i->field_0);
    uVar38 = ((byte)uVar14 & 0xf) & uVar38;
    bVar37 = (byte)uVar38;
    if (bVar37 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar7 = tray.dir.field_0._32_4_;
      auVar41._0_4_ = fVar7 * fVar7;
      fVar8 = tray.dir.field_0._36_4_;
      auVar41._4_4_ = fVar8 * fVar8;
      fVar9 = tray.dir.field_0._40_4_;
      auVar41._8_4_ = fVar9 * fVar9;
      fVar10 = tray.dir.field_0._44_4_;
      auVar41._12_4_ = fVar10 * fVar10;
      auVar42 = vfmadd231ps_fma(auVar41,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar42 = vfmadd231ps_fma(auVar42,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar41 = vrsqrt14ps_avx512vl(auVar42);
      auVar47._8_4_ = 0xbf000000;
      auVar47._0_8_ = 0xbf000000bf000000;
      auVar47._12_4_ = 0xbf000000;
      auVar42 = vmulps_avx512vl(auVar42,auVar47);
      fVar72 = auVar41._0_4_;
      fVar74 = auVar41._4_4_;
      fVar75 = auVar41._8_4_;
      fVar76 = auVar41._12_4_;
      auVar49._0_4_ = fVar72 * fVar72 * fVar72 * auVar42._0_4_;
      auVar49._4_4_ = fVar74 * fVar74 * fVar74 * auVar42._4_4_;
      auVar49._8_4_ = fVar75 * fVar75 * fVar75 * auVar42._8_4_;
      auVar49._12_4_ = fVar76 * fVar76 * fVar76 * auVar42._12_4_;
      auVar42._8_4_ = 0x3fc00000;
      auVar42._0_8_ = 0x3fc000003fc00000;
      auVar42._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar49,auVar41,auVar42);
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      uVar29 = uVar38;
      while (uVar29 != 0) {
        lVar30 = 0;
        for (uVar39 = uVar29; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar29 = uVar29 - 1 & uVar29;
        uVar39 = (ulong)(uint)((int)lVar30 * 4);
        auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar39 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar39 + 0x50)),0x1c);
        auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + uVar39 + 0x60)),0x28);
        fVar72 = *(float *)((long)pre.ray_space + (uVar39 - 0x10));
        auVar78._0_4_ = auVar42._0_4_ * fVar72;
        auVar78._4_4_ = auVar42._4_4_ * fVar72;
        auVar78._8_4_ = auVar42._8_4_ * fVar72;
        auVar78._12_4_ = auVar42._12_4_ * fVar72;
        auVar47 = vshufpd_avx(auVar78,auVar78,1);
        auVar42 = vmovshdup_avx(auVar78);
        auVar84._0_4_ = auVar42._0_4_ ^ 0x80000000;
        auVar42 = vunpckhps_avx(auVar78,auVar44);
        auVar84._4_12_ = auVar22;
        auVar49 = vshufps_avx(auVar42,auVar84,0x41);
        auVar81._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
        auVar81._8_8_ = auVar47._8_8_ ^ auVar50._8_8_;
        auVar42 = vdpps_avx(auVar49,auVar49,0x7f);
        auVar41 = vinsertps_avx(auVar81,auVar78,0x2a);
        auVar47 = vdpps_avx(auVar41,auVar41,0x7f);
        uVar14 = vcmpps_avx512vl(auVar47,auVar42,1);
        auVar42 = vpmovm2d_avx512vl(uVar14);
        auVar87._0_4_ = auVar42._0_4_;
        auVar87._4_4_ = auVar87._0_4_;
        auVar87._8_4_ = auVar87._0_4_;
        auVar87._12_4_ = auVar87._0_4_;
        uVar39 = vpmovd2m_avx512vl(auVar87);
        auVar55._4_4_ = (uint)((byte)(uVar39 >> 1) & 1) * auVar43._4_4_;
        auVar55._0_4_ = (uint)((byte)uVar39 & 1) * auVar43._0_4_;
        auVar55._8_4_ = (uint)((byte)(uVar39 >> 2) & 1) * auVar43._8_4_;
        auVar55._12_4_ = (uint)((byte)(uVar39 >> 3) & 1) * auVar43._12_4_;
        auVar42 = vblendvps_avx(auVar41,auVar49,auVar55);
        auVar47 = vdpps_avx(auVar42,auVar42,0x7f);
        auVar88._4_12_ = auVar22;
        auVar88._0_4_ = auVar47._0_4_;
        auVar41 = vrsqrt14ss_avx512f(auVar44,auVar88);
        fVar74 = auVar41._0_4_;
        fVar74 = fVar74 * 1.5 - auVar47._0_4_ * 0.5 * fVar74 * fVar74 * fVar74;
        auVar82._0_4_ = auVar42._0_4_ * fVar74;
        auVar82._4_4_ = auVar42._4_4_ * fVar74;
        auVar82._8_4_ = auVar42._8_4_ * fVar74;
        auVar82._12_4_ = auVar42._12_4_ * fVar74;
        auVar42 = vshufps_avx(auVar82,auVar82,0xc9);
        auVar47 = vshufps_avx(auVar78,auVar78,0xc9);
        auVar89._0_4_ = auVar82._0_4_ * auVar47._0_4_;
        auVar89._4_4_ = auVar82._4_4_ * auVar47._4_4_;
        auVar89._8_4_ = auVar82._8_4_ * auVar47._8_4_;
        auVar89._12_4_ = auVar82._12_4_ * auVar47._12_4_;
        auVar42 = vfmsub231ps_fma(auVar89,auVar78,auVar42);
        auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
        auVar42 = vdpps_avx(auVar47,auVar47,0x7f);
        auVar90._4_12_ = auVar22;
        auVar90._0_4_ = auVar42._0_4_;
        auVar41 = vrsqrt14ss_avx512f(auVar44,auVar90);
        fVar74 = auVar41._0_4_;
        fVar74 = fVar74 * 1.5 - auVar42._0_4_ * 0.5 * fVar74 * fVar74 * fVar74;
        auVar85._0_4_ = fVar74 * auVar47._0_4_;
        auVar85._4_4_ = fVar74 * auVar47._4_4_;
        auVar85._8_4_ = fVar74 * auVar47._8_4_;
        auVar85._12_4_ = fVar74 * auVar47._12_4_;
        auVar79._0_4_ = fVar72 * auVar78._0_4_;
        auVar79._4_4_ = fVar72 * auVar78._4_4_;
        auVar79._8_4_ = fVar72 * auVar78._8_4_;
        auVar79._12_4_ = fVar72 * auVar78._12_4_;
        auVar41 = vunpcklps_avx(auVar82,auVar79);
        auVar42 = vunpckhps_avx(auVar82,auVar79);
        auVar49 = vunpcklps_avx(auVar85,auVar44);
        auVar47 = vunpckhps_avx(auVar85,auVar44);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar42,auVar47);
        aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar41,auVar49);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar41,auVar49);
        pre.ray_space[lVar30].vx.field_0 = aVar13;
        pre.ray_space[lVar30].vy.field_0 = aVar11;
        pre.ray_space[lVar30].vz.field_0 = aVar12;
      }
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar91 = ZEXT1664(auVar43);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar92 = ZEXT1664(auVar44);
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar43);
      uVar29 = vcmpps_avx512vl(auVar42,auVar44,1);
      bVar28 = (bool)((byte)uVar29 & 1);
      iVar40 = auVar44._0_4_;
      auVar45._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * tray.dir.field_0._0_4_;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      iVar56 = auVar44._4_4_;
      auVar45._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * tray.dir.field_0._4_4_;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      iVar57 = auVar44._8_4_;
      iVar58 = auVar44._12_4_;
      auVar45._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * tray.dir.field_0._8_4_;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * tray.dir.field_0._12_4_;
      auVar42 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar43);
      uVar29 = vcmpps_avx512vl(auVar42,auVar44,1);
      bVar28 = (bool)((byte)uVar29 & 1);
      auVar46._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * tray.dir.field_0._16_4_;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * tray.dir.field_0._20_4_;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * tray.dir.field_0._24_4_;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * tray.dir.field_0._28_4_;
      auVar43 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar43);
      uVar29 = vcmpps_avx512vl(auVar43,auVar44,1);
      bVar28 = (bool)((byte)uVar29 & 1);
      auVar43._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * (int)fVar7;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      auVar43._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * (int)fVar8;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      auVar43._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * (int)fVar9;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      auVar43._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * (int)fVar10;
      auVar44 = vrcp14ps_avx512vl(auVar45);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar93 = ZEXT1664(auVar42);
      auVar41 = ZEXT816(0);
      auVar47 = vfnmadd213ps_avx512vl(auVar45,auVar44,auVar42);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar47,auVar44,auVar44)
      ;
      auVar44 = vrcp14ps_avx512vl(auVar46);
      auVar47 = vfnmadd213ps_avx512vl(auVar46,auVar44,auVar42);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar47,auVar44,auVar44)
      ;
      auVar44 = vrcp14ps_avx512vl(auVar43);
      auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar44,auVar42);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar43,auVar44,auVar44)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar41,1);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar43._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar29 & 1) * auVar43._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar43._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar43._12_4_;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,5);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar28 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar28 * auVar43._0_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar28 * auVar43._4_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar28 * auVar43._8_4_ | (uint)!bVar28 * 0x60;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar28 * auVar43._12_4_ | (uint)!bVar28 * 0x60;
      uVar29 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41,5);
      auVar43 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar28 = (bool)((byte)uVar29 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar28 * auVar43._0_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar28 * auVar43._4_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar28 * auVar43._8_4_ | (uint)!bVar28 * 0xa0;
      bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar28 * auVar43._12_4_ | (uint)!bVar28 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar94 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar43 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar37 & 1) * auVar43._0_4_ |
           (uint)!(bool)(bVar37 & 1) * stack_near[0].field_0._0_4_;
      bVar28 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar28 * auVar43._4_4_ | (uint)!bVar28 * stack_near[0].field_0._4_4_;
      bVar28 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar28 * auVar43._8_4_ | (uint)!bVar28 * stack_near[0].field_0._8_4_;
      bVar28 = SUB81(uVar38 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar28 * auVar43._12_4_ | (uint)!bVar28 * stack_near[0].field_0._12_4_;
      auVar48 = vmaxps_avx512vl(auVar48,auVar41);
      tray.tfar.field_0.i[0] =
           (uint)(bVar37 & 1) * auVar48._0_4_ | (uint)!(bool)(bVar37 & 1) * -0x800000;
      bVar28 = (bool)((byte)(uVar38 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar28 * auVar48._4_4_ | (uint)!bVar28 * -0x800000;
      bVar28 = (bool)((byte)(uVar38 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar28 * auVar48._8_4_ | (uint)!bVar28 * -0x800000;
      bVar28 = SUB81(uVar38 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar28 * auVar48._12_4_ | (uint)!bVar28 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_3714 = (ushort)uVar38 ^ 0xf;
      pNVar34 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar32 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      stack_node[1].ptr = sVar31;
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar95 = ZEXT1664(auVar48);
LAB_01d809fc:
      do {
        do {
          root.ptr = pNVar34[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d80fb8;
          pNVar34 = pNVar34 + -1;
          vVar1.field_0 =
               *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                ((vfloat<4> *)paVar32)[-1].field_0.v;
          auVar96 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar32 = &((vfloat<4> *)paVar32)[-1].field_0;
          uVar38 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar38 == '\0');
        uVar33 = (undefined4)uVar38;
        if (uVar36 < (uint)POPCOUNT(uVar33)) {
LAB_01d80a45:
          do {
            sVar31 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d80fb8;
              uVar14 = vcmpps_avx512vl(auVar96._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar14 != '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                uVar38 = (ulong)(~(byte)local_3714 & 0xf);
                bVar35 = 0;
                while (uVar38 != 0) {
                  lVar30 = 0;
                  for (uVar29 = uVar38; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                      ) {
                    lVar30 = lVar30 + 1;
                  }
                  uVar38 = uVar38 - 1 & uVar38;
                  cVar27 = (**(code **)((long)pvVar4 + (ulong)bVar2 * 0x40 + 0x18))
                                     (&pre,ray,lVar30,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar21 = (byte)(1 << ((uint)lVar30 & 0x1f));
                  if (cVar27 == '\0') {
                    bVar21 = 0;
                  }
                  bVar35 = bVar35 | bVar21;
                }
                bVar35 = (byte)local_3714 | bVar35;
                local_3714 = (uint)bVar35;
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar91 = ZEXT1664(auVar48);
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar92 = ZEXT1664(auVar48);
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar93 = ZEXT1664(auVar48);
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar94 = ZEXT1664(auVar48);
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar95 = ZEXT1664(auVar48);
                if (bVar35 == 0xf) {
                  local_3714._0_1_ = 0xf;
                  goto LAB_01d80fb8;
                }
                auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar28 = (bool)(bVar35 >> 1 & 1);
                bVar5 = (bool)(bVar35 >> 2 & 1);
                bVar6 = (bool)(bVar35 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar28 * auVar48._4_4_ | (uint)!bVar28 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar35 & 1) * auVar48._0_4_ |
                     (uint)!(bool)(bVar35 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar5 * auVar48._8_4_ | (uint)!bVar5 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar6 * auVar48._12_4_ | (uint)!bVar6 * tray.tfar.field_0.i[3];
              }
              goto LAB_01d809fc;
            }
            uVar38 = root.ptr & 0xfffffffffffffff0;
            aVar59 = auVar94._0_16_;
            for (lVar30 = 0x38;
                (auVar96 = ZEXT1664((undefined1  [16])aVar59), lVar30 != 0x40 &&
                (sVar3 = *(size_t *)((uVar38 - 0x1c0) + lVar30 * 8), sVar3 != 8));
                lVar30 = lVar30 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar33 = *(undefined4 *)((root.ptr - 0xa0) + lVar30 * 4);
                auVar65._4_4_ = uVar33;
                auVar65._0_4_ = uVar33;
                auVar65._8_4_ = uVar33;
                auVar65._12_4_ = uVar33;
                auVar44 = vfmsub132ps_fma(auVar65,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.x.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.x.field_0);
                uVar33 = *(undefined4 *)((root.ptr - 0x60) + lVar30 * 4);
                auVar69._4_4_ = uVar33;
                auVar69._0_4_ = uVar33;
                auVar69._8_4_ = uVar33;
                auVar69._12_4_ = uVar33;
                auVar42 = vfmsub132ps_fma(auVar69,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.y.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.y.field_0);
                uVar33 = *(undefined4 *)((root.ptr - 0x20) + lVar30 * 4);
                auVar77._4_4_ = uVar33;
                auVar77._0_4_ = uVar33;
                auVar77._8_4_ = uVar33;
                auVar77._12_4_ = uVar33;
                uVar33 = *(undefined4 *)((root.ptr - 0x80) + lVar30 * 4);
                auVar15._4_4_ = uVar33;
                auVar15._0_4_ = uVar33;
                auVar15._8_4_ = uVar33;
                auVar15._12_4_ = uVar33;
                auVar41 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.x.field_0,
                                     auVar15);
                uVar33 = *(undefined4 *)((root.ptr - 0x40) + lVar30 * 4);
                auVar16._4_4_ = uVar33;
                auVar16._0_4_ = uVar33;
                auVar16._8_4_ = uVar33;
                auVar16._12_4_ = uVar33;
                auVar49 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.y.field_0,
                                     auVar16);
                auVar47 = vfmsub132ps_fma(auVar77,(undefined1  [16])
                                                  tray.org_rdir.field_0.field_0.z.field_0,
                                          (undefined1  [16])tray.rdir.field_0.field_0.z.field_0);
                uVar33 = *(undefined4 *)(root.ptr + lVar30 * 4);
                auVar17._4_4_ = uVar33;
                auVar17._0_4_ = uVar33;
                auVar17._8_4_ = uVar33;
                auVar17._12_4_ = uVar33;
                auVar50 = vfmsub132ps_avx512vl
                                    ((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,
                                     (undefined1  [16])tray.org_rdir.field_0.field_0.z.field_0,
                                     auVar17);
                auVar48 = vpminsd_avx(auVar44,auVar41);
                auVar43 = vpminsd_avx(auVar42,auVar49);
                auVar48 = vpmaxsd_avx(auVar48,auVar43);
                auVar43 = vpminsd_avx(auVar47,auVar50);
                auVar48 = vpmaxsd_avx(auVar48,auVar43);
                auVar43 = vpmaxsd_avx(auVar44,auVar41);
                auVar44 = vpmaxsd_avx(auVar42,auVar49);
                auVar44 = vpminsd_avx(auVar43,auVar44);
                auVar43 = vpmaxsd_avx(auVar47,auVar50);
                auVar44 = vpminsd_avx(auVar44,auVar43);
                auVar43 = vpmaxsd_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
                auVar44 = vpminsd_avx(auVar44,(undefined1  [16])tray.tfar.field_0);
                uVar29 = vpcmpd_avx512vl(auVar43,auVar44,2);
                uVar29 = uVar29 & 0xf;
              }
              else {
                uVar33 = *(undefined4 *)((uVar38 - 0xa0) + lVar30 * 4);
                auVar62._4_4_ = uVar33;
                auVar62._0_4_ = uVar33;
                auVar62._8_4_ = uVar33;
                auVar62._12_4_ = uVar33;
                uVar33 = *(undefined4 *)((uVar38 - 0x80) + lVar30 * 4);
                auVar61._4_4_ = uVar33;
                auVar61._0_4_ = uVar33;
                auVar61._8_4_ = uVar33;
                auVar61._12_4_ = uVar33;
                uVar33 = *(undefined4 *)((uVar38 - 0x60) + lVar30 * 4);
                auVar60._4_4_ = uVar33;
                auVar60._0_4_ = uVar33;
                auVar60._8_4_ = uVar33;
                auVar60._12_4_ = uVar33;
                uVar33 = *(undefined4 *)((uVar38 - 0x40) + lVar30 * 4);
                auVar86._4_4_ = uVar33;
                auVar86._0_4_ = uVar33;
                auVar86._8_4_ = uVar33;
                auVar86._12_4_ = uVar33;
                uVar33 = *(undefined4 *)((uVar38 - 0x20) + lVar30 * 4);
                auVar83._4_4_ = uVar33;
                auVar83._0_4_ = uVar33;
                auVar83._8_4_ = uVar33;
                auVar83._12_4_ = uVar33;
                uVar33 = *(undefined4 *)(uVar38 + lVar30 * 4);
                auVar73._4_4_ = uVar33;
                auVar73._0_4_ = uVar33;
                auVar73._8_4_ = uVar33;
                auVar73._12_4_ = uVar33;
                fVar7 = *(float *)(uVar38 + 0x20 + lVar30 * 4);
                auVar70._4_4_ = fVar7;
                auVar70._0_4_ = fVar7;
                auVar70._8_4_ = fVar7;
                auVar70._12_4_ = fVar7;
                fVar8 = *(float *)(uVar38 + 0x40 + lVar30 * 4);
                auVar67._4_4_ = fVar8;
                auVar67._0_4_ = fVar8;
                auVar67._8_4_ = fVar8;
                auVar67._12_4_ = fVar8;
                fVar9 = *(float *)(uVar38 + 0x60 + lVar30 * 4);
                auVar64._4_4_ = fVar9;
                auVar64._0_4_ = fVar9;
                auVar64._8_4_ = fVar9;
                auVar64._12_4_ = fVar9;
                auVar23._4_4_ = tray.org.field_0._4_4_;
                auVar23._0_4_ = tray.org.field_0._0_4_;
                auVar23._8_4_ = tray.org.field_0._8_4_;
                auVar23._12_4_ = tray.org.field_0._12_4_;
                auVar24._4_4_ = tray.org.field_0._20_4_;
                auVar24._0_4_ = tray.org.field_0._16_4_;
                auVar24._8_4_ = tray.org.field_0._24_4_;
                auVar24._12_4_ = tray.org.field_0._28_4_;
                auVar25._4_4_ = tray.org.field_0._36_4_;
                auVar25._0_4_ = tray.org.field_0._32_4_;
                auVar25._8_4_ = tray.org.field_0._40_4_;
                auVar25._12_4_ = tray.org.field_0._44_4_;
                auVar48._0_4_ = (float)tray.dir.field_0._32_4_ * fVar7;
                auVar48._4_4_ = (float)tray.dir.field_0._36_4_ * fVar7;
                auVar48._8_4_ = (float)tray.dir.field_0._40_4_ * fVar7;
                auVar48._12_4_ = (float)tray.dir.field_0._44_4_ * fVar7;
                auVar44._0_4_ = (float)tray.dir.field_0._32_4_ * fVar8;
                auVar44._4_4_ = (float)tray.dir.field_0._36_4_ * fVar8;
                auVar44._8_4_ = (float)tray.dir.field_0._40_4_ * fVar8;
                auVar44._12_4_ = (float)tray.dir.field_0._44_4_ * fVar8;
                auVar80._0_4_ = (float)tray.dir.field_0._32_4_ * fVar9;
                auVar80._4_4_ = (float)tray.dir.field_0._36_4_ * fVar9;
                auVar80._8_4_ = (float)tray.dir.field_0._40_4_ * fVar9;
                auVar80._12_4_ = (float)tray.dir.field_0._44_4_ * fVar9;
                auVar48 = vfmadd231ps_avx512vl
                                    (auVar48,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar86);
                auVar43 = vfmadd231ps_avx512vl
                                    (auVar44,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar83);
                auVar44 = vfmadd231ps_avx512vl
                                    (auVar80,auVar73,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar48 = vfmadd231ps_fma(auVar48,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar62);
                auVar43 = vfmadd231ps_fma(auVar43,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar61);
                auVar44 = vfmadd231ps_fma(auVar44,auVar60,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar47 = auVar91._0_16_;
                auVar42 = vandps_avx512vl(auVar48,auVar47);
                auVar41 = auVar92._0_16_;
                uVar29 = vcmpps_avx512vl(auVar42,auVar41,1);
                bVar28 = (bool)((byte)uVar29 & 1);
                iVar40 = auVar92._0_4_;
                auVar52._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * auVar48._0_4_;
                bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                iVar56 = auVar92._4_4_;
                auVar52._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * auVar48._4_4_;
                bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                iVar57 = auVar92._8_4_;
                iVar58 = auVar92._12_4_;
                auVar52._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * auVar48._8_4_;
                bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar52._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * auVar48._12_4_;
                auVar48 = vandps_avx512vl(auVar43,auVar47);
                uVar29 = vcmpps_avx512vl(auVar48,auVar41,1);
                bVar28 = (bool)((byte)uVar29 & 1);
                auVar53._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * auVar43._0_4_;
                bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar53._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * auVar43._4_4_;
                bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar53._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * auVar43._8_4_;
                bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar53._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * auVar43._12_4_;
                auVar48 = vandps_avx512vl(auVar44,auVar47);
                uVar29 = vcmpps_avx512vl(auVar48,auVar41,1);
                bVar28 = (bool)((byte)uVar29 & 1);
                auVar54._0_4_ = (uint)bVar28 * iVar40 | (uint)!bVar28 * auVar44._0_4_;
                bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar54._4_4_ = (uint)bVar28 * iVar56 | (uint)!bVar28 * auVar44._4_4_;
                bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar54._8_4_ = (uint)bVar28 * iVar57 | (uint)!bVar28 * auVar44._8_4_;
                bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar54._12_4_ = (uint)bVar28 * iVar58 | (uint)!bVar28 * auVar44._12_4_;
                auVar48 = vrcp14ps_avx512vl(auVar52);
                auVar42 = auVar93._0_16_;
                auVar43 = vfnmadd213ps_avx512vl(auVar52,auVar48,auVar42);
                auVar48 = vfmadd132ps_fma(auVar43,auVar48,auVar48);
                auVar43 = vrcp14ps_avx512vl(auVar53);
                auVar44 = vfnmadd213ps_avx512vl(auVar53,auVar43,auVar42);
                auVar43 = vfmadd132ps_fma(auVar44,auVar43,auVar43);
                auVar44 = vrcp14ps_avx512vl(auVar54);
                auVar42 = vfnmadd213ps_avx512vl(auVar54,auVar44,auVar42);
                auVar44 = vfmadd132ps_fma(auVar42,auVar44,auVar44);
                auVar41 = auVar95._0_16_;
                auVar49 = vxorps_avx512vl(auVar48,auVar41);
                auVar50 = vxorps_avx512vl(auVar43,auVar41);
                uVar33 = *(undefined4 *)(uVar38 + 0x80 + lVar30 * 4);
                auVar18._4_4_ = uVar33;
                auVar18._0_4_ = uVar33;
                auVar18._8_4_ = uVar33;
                auVar18._12_4_ = uVar33;
                auVar42 = vfmadd213ps_avx512vl(auVar70,auVar25,auVar18);
                uVar33 = *(undefined4 *)(uVar38 + 0xa0 + lVar30 * 4);
                auVar19._4_4_ = uVar33;
                auVar19._0_4_ = uVar33;
                auVar19._8_4_ = uVar33;
                auVar19._12_4_ = uVar33;
                auVar47 = vfmadd213ps_avx512vl(auVar67,auVar25,auVar19);
                auVar55 = vxorps_avx512vl(auVar44,auVar41);
                uVar33 = *(undefined4 *)(uVar38 + 0xc0 + lVar30 * 4);
                auVar20._4_4_ = uVar33;
                auVar20._0_4_ = uVar33;
                auVar20._8_4_ = uVar33;
                auVar20._12_4_ = uVar33;
                auVar41 = vfmadd213ps_avx512vl(auVar64,auVar25,auVar20);
                auVar42 = vfmadd231ps_fma(auVar42,auVar24,auVar86);
                auVar47 = vfmadd231ps_fma(auVar47,auVar24,auVar83);
                auVar41 = vfmadd231ps_fma(auVar41,auVar24,auVar73);
                auVar42 = vfmadd231ps_fma(auVar42,auVar23,auVar62);
                auVar63._0_4_ = auVar49._0_4_ * auVar42._0_4_;
                auVar63._4_4_ = auVar49._4_4_ * auVar42._4_4_;
                auVar63._8_4_ = auVar49._8_4_ * auVar42._8_4_;
                auVar63._12_4_ = auVar49._12_4_ * auVar42._12_4_;
                auVar42 = vfmadd231ps_fma(auVar47,auVar23,auVar61);
                auVar47 = vmulps_avx512vl(auVar42,auVar50);
                auVar42 = vfmadd231ps_fma(auVar41,auVar23,auVar60);
                auVar42 = vmulps_avx512vl(auVar42,auVar55);
                auVar66._0_4_ = auVar48._0_4_ + auVar63._0_4_;
                auVar66._4_4_ = auVar48._4_4_ + auVar63._4_4_;
                auVar66._8_4_ = auVar48._8_4_ + auVar63._8_4_;
                auVar66._12_4_ = auVar48._12_4_ + auVar63._12_4_;
                auVar68._0_4_ = auVar43._0_4_ + auVar47._0_4_;
                auVar68._4_4_ = auVar43._4_4_ + auVar47._4_4_;
                auVar68._8_4_ = auVar43._8_4_ + auVar47._8_4_;
                auVar68._12_4_ = auVar43._12_4_ + auVar47._12_4_;
                auVar71._0_4_ = auVar44._0_4_ + auVar42._0_4_;
                auVar71._4_4_ = auVar44._4_4_ + auVar42._4_4_;
                auVar71._8_4_ = auVar44._8_4_ + auVar42._8_4_;
                auVar71._12_4_ = auVar44._12_4_ + auVar42._12_4_;
                auVar48 = vpminsd_avx(auVar63,auVar66);
                auVar43 = vpminsd_avx(auVar47,auVar68);
                auVar48 = vpmaxsd_avx(auVar48,auVar43);
                auVar43 = vpminsd_avx(auVar42,auVar71);
                auVar48 = vpmaxsd_avx(auVar48,auVar43);
                auVar43 = vpmaxsd_avx(auVar63,auVar66);
                auVar44 = vpmaxsd_avx(auVar47,auVar68);
                auVar44 = vpminsd_avx(auVar43,auVar44);
                auVar43 = vpmaxsd_avx(auVar42,auVar71);
                auVar44 = vpminsd_avx(auVar44,auVar43);
                auVar43 = vpmaxsd_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
                auVar44 = vpminsd_avx(auVar44,(undefined1  [16])tray.tfar.field_0);
                uVar29 = vcmpps_avx512vl(auVar43,auVar44,2);
              }
              sVar26 = sVar31;
              aVar51 = aVar59;
              if ((uVar29 & 0xf) != 0) {
                auVar43 = vblendmps_avx512vl((undefined1  [16])auVar94._0_16_,auVar48);
                bVar28 = (bool)((byte)uVar29 & 1);
                aVar51._0_4_ = (uint)bVar28 * auVar43._0_4_ | (uint)!bVar28 * auVar48._0_4_;
                bVar28 = (bool)((byte)(uVar29 >> 1) & 1);
                aVar51._4_4_ = (uint)bVar28 * auVar43._4_4_ | (uint)!bVar28 * auVar48._4_4_;
                bVar28 = (bool)((byte)(uVar29 >> 2) & 1);
                aVar51._8_4_ = (uint)bVar28 * auVar43._8_4_ | (uint)!bVar28 * auVar48._8_4_;
                bVar28 = (bool)((byte)(uVar29 >> 3) & 1);
                aVar51._12_4_ = (uint)bVar28 * auVar43._12_4_ | (uint)!bVar28 * auVar48._12_4_;
                sVar26 = sVar3;
                if (sVar31 != 8) {
                  pNVar34->ptr = sVar31;
                  pNVar34 = pNVar34 + 1;
                  *paVar32 = aVar59;
                  paVar32 = paVar32 + 1;
                }
              }
              aVar59 = aVar51;
              sVar31 = sVar26;
            }
            if (sVar31 == 8) goto LAB_01d80d91;
            uVar14 = vcmpps_avx512vl((undefined1  [16])aVar59,(undefined1  [16])tray.tfar.field_0,9)
            ;
            root.ptr = sVar31;
          } while ((byte)uVar36 < (byte)POPCOUNT((int)uVar14));
          pNVar34->ptr = sVar31;
          pNVar34 = pNVar34 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar32->v = aVar59;
          paVar32 = paVar32 + 1;
LAB_01d80d91:
          iVar40 = 4;
        }
        else {
          while (uVar38 != 0) {
            sVar31 = 0;
            for (uVar29 = uVar38; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
              sVar31 = sVar31 + 1;
            }
            uVar38 = uVar38 - 1 & uVar38;
            bVar28 = occluded1(This,bvh,root,sVar31,&pre,ray,&tray,context);
            bVar2 = (byte)(1 << ((uint)sVar31 & 0x1f));
            if (!bVar28) {
              bVar2 = 0;
            }
            local_3714 = (uint)((byte)local_3714 | bVar2);
          }
          iVar40 = 3;
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar91 = ZEXT1664(auVar48);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar92 = ZEXT1664(auVar48);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar93 = ZEXT1664(auVar48);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar94 = ZEXT1664(auVar48);
          auVar48 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar95 = ZEXT1664(auVar48);
          auVar96 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((byte)local_3714 != 0xf) {
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_3714 & 1) * auVar48._0_4_ |
                 (uint)!(bool)((byte)local_3714 & 1) * tray.tfar.field_0.i[0];
            bVar28 = (bool)((byte)(local_3714 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar28 * auVar48._4_4_ | (uint)!bVar28 * tray.tfar.field_0.i[1];
            bVar28 = (bool)((byte)(local_3714 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar28 * auVar48._8_4_ | (uint)!bVar28 * tray.tfar.field_0.i[2];
            bVar28 = (bool)((byte)(local_3714 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar28 * auVar48._12_4_ | (uint)!bVar28 * tray.tfar.field_0.i[3];
            iVar40 = 2;
          }
          if (uVar36 < (uint)POPCOUNT(uVar33)) goto LAB_01d80a45;
        }
        if (iVar40 == 3) {
LAB_01d80fb8:
          local_3714._0_1_ = (byte)local_3714 & bVar37;
          bVar28 = (bool)((byte)local_3714 >> 1 & 1);
          bVar5 = (bool)((byte)local_3714 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)((byte)local_3714 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_3714 & 1) * *(int *)(ray + 0x80);
          *(uint *)(ray + 0x84) = (uint)bVar28 * -0x800000 | (uint)!bVar28 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_3714 >> 3) * -0x800000 |
               (uint)!(bool)((byte)local_3714 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }